

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

void appendVariant(QCborContainerPrivate *d,QVariant *variant)

{
  int iVar1;
  QMetaType iface;
  qsizetype objectSize;
  char *data;
  long in_FS_OFFSET;
  QStringView s;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iface = QVariant::metaType(variant);
  if (iface.d_ptr == (QMetaTypeInterface *)0x0) {
LAB_002ee392:
    QCborValue::fromVariant((QCborValue *)local_38,variant);
    QCborContainerPrivate::insertAt(d,(d->elements).d.size,(QCborValue *)local_38,MoveContainer);
    local_38._8_8_ = (QCborContainerPrivate *)0x0;
    local_38._16_4_ = 0x117;
    QCborValue::~QCborValue((QCborValue *)local_38);
  }
  else {
    iVar1 = ((iface.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar1 == 0) {
      iVar1 = QMetaType::registerHelper(iface.d_ptr);
    }
    if (iVar1 == 0xc) {
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVariant::toByteArray((QByteArray *)local_38,variant);
      data = (char *)local_38._8_8_;
      if ((QCborContainerPrivate *)local_38._8_8_ == (QCborContainerPrivate *)0x0) {
        data = &QByteArray::_empty;
      }
      QCborContainerPrivate::appendByteData(d,data,local_38._16_8_,ByteArray,(ValueFlags)0x0);
      if ((QArrayData *)local_38._0_8_ == (QArrayData *)0x0) goto LAB_002ee3cb;
      LOCK();
      (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i != 0)
      goto LAB_002ee3cb;
      objectSize = 1;
    }
    else {
      if (iVar1 != 10) goto LAB_002ee392;
      QVariant::toString((QString *)local_38,variant);
      s.m_data = (storage_type_conflict *)local_38._8_8_;
      s.m_size = local_38._16_8_;
      QCborContainerPrivate::append(d,s);
      if ((QArrayData *)local_38._0_8_ == (QArrayData *)0x0) goto LAB_002ee3cb;
      LOCK();
      (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i != 0)
      goto LAB_002ee3cb;
      objectSize = 2;
    }
    QArrayData::deallocate((QArrayData *)local_38._0_8_,objectSize,0x10);
  }
LAB_002ee3cb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void appendVariant(QCborContainerPrivate *d, const QVariant &variant)
{
    // Handle strings and byte arrays directly, to avoid creating a temporary
    // dummy container to hold their data.
    int type = variant.metaType().id();
    if (type == QMetaType::QString) {
        d->append(variant.toString());
    } else if (type == QMetaType::QByteArray) {
        QByteArray ba = variant.toByteArray();
        d->appendByteData(ba.constData(), ba.size(), QCborValue::ByteArray);
    } else {
        // For everything else, use the function below.
        d->append(QCborValue::fromVariant(variant));
    }
}